

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx::create_pipeline_int8_x86(Convolution_x86_avx *this,Option *opt)

{
  uint outch;
  Option *opt_00;
  _func_int **pp_Var1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  _func_int *p_Var5;
  int _h;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int j;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint _w;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int i;
  ulong uVar18;
  Mat weight_data_r2;
  Mat local_78;
  
  opt_00 = (Option *)this->_vptr_Convolution_x86_avx;
  lVar12 = *(long *)&opt_00[-1].use_shader_pack8;
  outch = *(uint *)((long)&(this->weight_data_3x3_winograd63).h + lVar12);
  iVar10 = *(int *)((long)&(this->weight_data_3x3_winograd63).d + lVar12);
  iVar6 = *(int *)((long)&(this->weight_data_3x3_winograd63).c + lVar12);
  _w = iVar6 * iVar10;
  uVar7 = (long)*(int *)((long)&(this->weight_data_int8).elemsize + lVar12 + 4) / (long)(int)_w;
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / (long)(int)outch;
  _h = (int)uVar7;
  uVar15 = 1;
  uVar17 = 1;
  if (opt->use_packing_layout == true) {
    uVar15 = 1;
    if ((uVar7 & 7) == 0) {
      uVar15 = 8;
    }
    uVar17 = (ulong)((uint)((outch & 3) == 0) * 3 + 1);
  }
  iVar14 = (int)uVar15;
  iVar16 = (int)uVar17;
  if ((iVar14 == 1) && (iVar16 == 1)) {
    if (((((iVar6 == 3) && (iVar10 == 3)) && (opt->use_winograd_convolution != false)) &&
        (((*(int *)(&(this->weight_data_3x3_winograd63).field_0x3c + lVar12) == 1 &&
          (*(int *)((long)&(this->weight_data_3x3_winograd63).cstep + lVar12) == 1)) &&
         ((*(int *)((long)&(this->weight_data_3x3_winograd63).cstep + lVar12 + 4) == 1 &&
          ((0xf < (int)outch && (*(int *)((long)&this->convolution_dilation1 + lVar12) == 1))))))))
       && (0xf < _h)) {
      conv3x3s1_winograd23_transform_kernel_int8_sse
                ((Mat *)((long)&(this->weight_data_3x3_winograd23_int8).dims + lVar12),
                 &this->weight_data_3x3_winograd23_int8,_h,outch,opt_00);
    }
  }
  else {
    Mat::reshape(&local_78,
                 (Mat *)((long)&(this->weight_data_3x3_winograd23_int8).dims +
                        *(long *)&opt_00[-1].use_shader_pack8),_w,_h,
                 *(int *)((long)&(this->weight_data_3x3_winograd63).h +
                         *(long *)&opt_00[-1].use_shader_pack8),(Allocator *)0x0);
    Mat::create(&this->weight_data_int8,_w,_h / iVar14,
                *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                        (long)&(this->weight_data_3x3_winograd63).data) / iVar16,
                (ulong)(uint)(iVar16 * iVar14),iVar16 * iVar14,(Allocator *)0x0);
    pp_Var1 = this->_vptr_Convolution_x86_avx;
    if (iVar16 <= *(int *)(pp_Var1[-3] + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
      uVar7 = 0;
      do {
        if (iVar14 <= _h) {
          sVar2 = (this->weight_data_int8).cstep;
          sVar3 = (this->weight_data_int8).elemsize;
          pvVar4 = (this->weight_data_int8).data;
          iVar10 = (this->weight_data_int8).w;
          uVar9 = 0;
          do {
            if (0 < (int)_w) {
              lVar12 = (long)pvVar4 +
                       ((uVar9 & 0xffffffff) / uVar15) * (long)iVar10 * sVar3 +
                       ((uVar7 & 0xffffffff) / uVar17) * sVar2 * sVar3;
              uVar8 = 0;
              do {
                uVar11 = 0;
                do {
                  lVar13 = lVar12;
                  uVar18 = 0;
                  do {
                    *(undefined1 *)(lVar13 + uVar18) =
                         *(undefined1 *)
                          ((long)local_78.data +
                          uVar8 + (uVar9 + uVar18) * local_78.elemsize * (long)local_78.w +
                                  local_78.cstep * (uVar11 + uVar7) * local_78.elemsize);
                    uVar18 = uVar18 + 1;
                  } while (uVar15 != uVar18);
                  uVar11 = uVar11 + 1;
                  lVar12 = lVar13 + uVar18;
                } while (uVar11 != uVar17);
                uVar8 = uVar8 + 1;
                lVar12 = lVar13 + uVar18;
              } while (uVar8 != _w);
            }
            uVar9 = uVar9 + uVar15;
          } while ((long)uVar9 < (long)((long)_h - (ulong)(iVar14 - 1)));
        }
        uVar7 = uVar7 + uVar17;
      } while ((long)((iVar16 - 1) + uVar7) <
               (long)*(int *)(pp_Var1[-3] + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((iVar14 == 8) && (iVar16 == 4)) {
      p_Var5 = this->_vptr_Convolution_x86_avx[-3];
      iVar10 = *(int *)(p_Var5 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if ((iVar10 == 1) &&
         (((((*(int *)(p_Var5 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var5 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           ((*(int *)(p_Var5 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var5) == 1)))) ||
          ((((*(int *)(p_Var5 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             ((*(int *)(p_Var5 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
              (*(int *)(p_Var5 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
            (*(int *)(p_Var5 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 2)) &&
           (*(int *)((long)&this->convolution_dilation1 + (long)p_Var5) == 2)))))) {
        iVar6 = *(int *)(p_Var5 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar10 = 1;
        iVar14 = 1;
      }
      else {
        if (opt->use_sgemm_convolution != true) {
          return 0;
        }
        iVar6 = *(int *)(p_Var5 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar14 = *(int *)(p_Var5 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      }
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var5 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data),
                 &this->weight_data_int8,_h,iVar6,iVar10,iVar14);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
            //         conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
        }
        else
        {
            // TODO offline transform weight
        }

        return 0;
    }

    // src = kw-kh-inch-outch
    // dst = pa-pb-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_int8.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_int8.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                signed char* g00 = g0.row<signed char>(p / elempack);

                for (int k = 0; k < maxk; k++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const signed char* k00 = weight_data_r2.channel(q + j).row<const signed char>(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
    }
#endif // __SSE2__

    return 0;
}